

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

bool __thiscall
SingleNodeColumnSampler<long_double,_float>::initialize
          (SingleNodeColumnSampler<long_double,_float> *this,double *weights,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *col_indices,size_t curr_pos,
          size_t n_sample,bool backup_weights)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  double dVar1;
  size_t *psVar2;
  pointer pdVar3;
  pointer puVar4;
  unsigned_long uVar5;
  size_t sVar6;
  pointer puVar7;
  runtime_error *this_03;
  size_t sVar8;
  ulong uVar9;
  size_type __n;
  size_t col_3;
  bool bVar10;
  longdouble lVar11;
  reference rVar12;
  long local_58;
  ushort uStack_50;
  
  if (curr_pos == 0) {
LAB_0025f919:
    bVar10 = false;
  }
  else {
    puVar7 = (col_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_start;
    this->col_indices = puVar7;
    this->curr_pos = curr_pos;
    this->n_left = curr_pos;
    this->weights_orig = weights;
    sVar6 = log2ceil(curr_pos);
    uVar9 = 3;
    if (3 < sVar6) {
      uVar9 = sVar6;
    }
    if (uVar9 < n_sample) {
      this->using_tree = true;
      this->backup_weights = false;
      this_01 = &this->used_weights;
      if ((this->used_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this->used_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<double,_std::allocator<double>_>::reserve
                  (this_01,(long)(col_indices->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 3);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  (&this->mapped_indices,
                   (long)(col_indices->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(col_indices->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 3);
        std::vector<double,_std::allocator<double>_>::reserve
                  (&this->tree_weights,
                   (long)(col_indices->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(col_indices->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 2);
        curr_pos = this->curr_pos;
      }
      std::vector<double,_std::allocator<double>_>::resize(this_01,curr_pos);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&this->mapped_indices,this->curr_pos);
      psVar2 = this->col_indices;
      pdVar3 = (this->used_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar7 = (this->mapped_indices).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar9 = 0; uVar9 < this->curr_pos; uVar9 = uVar9 + 1) {
        sVar6 = psVar2[uVar9];
        puVar7[uVar9] = sVar6;
        dVar1 = weights[sVar6];
        pdVar3[uVar9] = dVar1;
        if ((dVar1 == 0.0) && (!NAN(dVar1))) {
          this->n_left = this->n_left - 1;
        }
      }
      this_02 = &this->tree_weights;
      std::vector<double,_std::allocator<double>_>::resize(this_02,0);
      build_btree_sampler<double>
                (this_02,(this->used_weights).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start,this->curr_pos,&this->tree_levels,
                 &this->offset);
      this->n_inf = 0;
      if (ABS(*(this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start) == INFINITY) {
        puVar7 = (this->mapped_inf_indices).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (puVar7 == (this->mapped_inf_indices).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                    (&this->mapped_inf_indices,this->curr_pos);
          puVar7 = (this->mapped_inf_indices).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        psVar2 = this->col_indices;
        pdVar3 = (this->used_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar4 = (this->mapped_indices).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (uVar9 = 0; uVar9 < this->curr_pos; uVar9 = uVar9 + 1) {
          uVar5 = psVar2[uVar9];
          sVar6 = this->n_inf;
          if (ABS(weights[uVar5]) == INFINITY) {
            this->n_inf = sVar6 + 1;
            puVar7[sVar6] = uVar5;
            weights[psVar2[uVar9]] = 0.0;
          }
          else {
            puVar4[uVar9 - sVar6] = uVar5;
            pdVar3[uVar9 - this->n_inf] = weights[psVar2[uVar9]];
          }
        }
        std::vector<double,_std::allocator<double>_>::resize(this_02,0);
        build_btree_sampler<double>
                  (this_02,(this->used_weights).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start,this->curr_pos - this->n_inf,
                   &this->tree_levels,&this->offset);
      }
      std::vector<double,_std::allocator<double>_>::resize(this_01,0);
      if ((*(this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start <= 0.0) && (this->n_inf == 0)) {
        return false;
      }
    }
    else {
      this->using_tree = false;
      this->backup_weights = backup_weights;
      sVar6 = curr_pos;
      if (backup_weights) {
        if ((this->weights_own).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (this->weights_own).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<double,_std::allocator<double>_>::resize
                    (&this->weights_own,
                     (long)(col_indices->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 3);
          curr_pos = this->curr_pos;
        }
        std::vector<double,std::allocator<double>>::_M_assign_aux<double*>
                  ((vector<double,std::allocator<double>> *)&this->weights_own,weights,
                   weights + curr_pos);
        puVar7 = this->col_indices;
        curr_pos = this->curr_pos;
        sVar6 = this->n_left;
      }
      lVar11 = (longdouble)0;
      this->cumw = lVar11;
      for (sVar8 = 0; curr_pos != sVar8; sVar8 = sVar8 + 1) {
        dVar1 = weights[puVar7[sVar8]];
        lVar11 = lVar11 + (longdouble)dVar1;
        this->cumw = lVar11;
        if ((dVar1 == 0.0) && (!NAN(dVar1))) {
          sVar6 = sVar6 - 1;
          this->n_left = sVar6;
        }
      }
      if (NAN(lVar11)) {
        this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_03,"NAs encountered. Try using a different value for \'missing_action\'.\n")
        ;
        __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      this->n_inf = 0;
      local_58 = SUB108(lVar11,0);
      uStack_50 = (ushort)((unkuint10)lVar11 >> 0x40);
      bVar10 = true;
      if ((~uStack_50 & 0x7fff) == 0 && local_58 == -0x8000000000000000) {
        this_00 = &this->inifinite_weights;
        __n = (long)(col_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(col_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
        if (((this->inifinite_weights).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p ==
             (this->inifinite_weights).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
           ((this->inifinite_weights).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0)) {
          std::vector<bool,_std::allocator<bool>_>::resize(this_00,__n,false);
        }
        else {
          std::vector<bool,_std::allocator<bool>_>::_M_fill_assign(this_00,__n,false);
        }
        this->cumw = (longdouble)0;
        for (uVar9 = 0; uVar9 < this->curr_pos; uVar9 = uVar9 + 1) {
          if (ABS(weights[this->col_indices[uVar9]]) == INFINITY) {
            this->n_inf = this->n_inf + 1;
            rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (this_00,this->col_indices[uVar9]);
            *rVar12._M_p = *rVar12._M_p | rVar12._M_mask;
            weights[this->col_indices[uVar9]] = 0.0;
          }
          else {
            this->cumw = this->cumw + (longdouble)weights[this->col_indices[uVar9]];
          }
        }
        lVar11 = this->cumw;
        bVar10 = this->n_inf == 0;
      }
      if (((lVar11 == (longdouble)0) && (!NAN(lVar11) && !NAN((longdouble)0))) && (bVar10))
      goto LAB_0025f919;
    }
    bVar10 = true;
  }
  return bVar10;
}

Assistant:

bool SingleNodeColumnSampler<ldouble_safe, real_t>::initialize
(
    double *restrict weights,
    std::vector<size_t> *col_indices,
    size_t curr_pos,
    size_t n_sample,
    bool backup_weights
)
{
    if (!curr_pos) return false;

    this->col_indices = col_indices->data();
    this->curr_pos = curr_pos;
    this->n_left = this->curr_pos;
    this->weights_orig = weights;
    
    if (n_sample > std::max(log2ceil(this->curr_pos), (size_t)3))
    {
        this->using_tree = true;
        this->backup_weights = false;

        if (this->used_weights.empty()) {
            this->used_weights.reserve(col_indices->size());
            this->mapped_indices.reserve(col_indices->size());
            this->tree_weights.reserve(2 * col_indices->size());
        }

        this->used_weights.resize(this->curr_pos);
        this->mapped_indices.resize(this->curr_pos);

        for (size_t col = 0; col < this->curr_pos; col++) {
            this->mapped_indices[col] = this->col_indices[col];
            this->used_weights[col] = weights[this->col_indices[col]];
            if (!weights[this->col_indices[col]]) this->n_left--;
        }

        this->tree_weights.resize(0);
        build_btree_sampler(this->tree_weights, this->used_weights.data(),
                            this->curr_pos, this->tree_levels, this->offset);

        this->n_inf = 0;
        if (std::isinf(this->tree_weights[0]))
        {
            if (this->mapped_inf_indices.empty())
                this->mapped_inf_indices.resize(this->curr_pos);

            for (size_t col = 0; col < this->curr_pos; col++)
            {
                if (std::isinf(weights[this->col_indices[col]]))
                {
                    this->mapped_inf_indices[this->n_inf++] = this->col_indices[col];
                    weights[this->col_indices[col]] = 0;
                }

                else
                {
                    this->mapped_indices[col - this->n_inf] = this->col_indices[col];
                    this->used_weights[col - this->n_inf] = weights[this->col_indices[col]];
                }
            }

            this->tree_weights.resize(0);
            build_btree_sampler(this->tree_weights, this->used_weights.data(),
                                this->curr_pos - this->n_inf, this->tree_levels, this->offset);
        }

        this->used_weights.resize(0);

        if (this->tree_weights[0] <= 0 && !this->n_inf)
            return false;
    }

    else
    {
        this->using_tree = false;
        this->backup_weights = backup_weights;

        if (this->backup_weights)
        {
            if (this->weights_own.empty())
                this->weights_own.resize(col_indices->size());
            this->weights_own.assign(weights, weights + this->curr_pos);
        }

        this->cumw = 0;
        for (size_t col = 0; col < this->curr_pos; col++) {
            this->cumw += weights[this->col_indices[col]];
            if (!weights[this->col_indices[col]]) this->n_left--;
        }

        if (std::isnan(this->cumw))
            throw std::runtime_error("NAs encountered. Try using a different value for 'missing_action'.\n");

        /* if it's infinite, will choose among columns with infinite weight first */
        this->n_inf = 0;
        if (std::isinf(this->cumw))
        {
            if (this->inifinite_weights.empty())
                this->inifinite_weights.resize(col_indices->size());
            else
                this->inifinite_weights.assign(col_indices->size(), false);

            this->cumw = 0;
            for (size_t col = 0; col < this->curr_pos; col++)
            {
                if (std::isinf(weights[this->col_indices[col]])) {
                    this->n_inf++;
                    this->inifinite_weights[this->col_indices[col]] = true;
                    weights[this->col_indices[col]] = 0;
                }

                else {
                    this->cumw += weights[this->col_indices[col]];
                }
            }
        }

        if (!this->cumw && !this->n_inf) return false;
    }

    return true;
}